

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O2

size_t tool_header_cb(char *ptr,size_t size,size_t nmemb,void *userdata)

{
  byte *pbVar1;
  void *__ptr;
  HdrCbData *hdrcbdata;
  OutStruct *outs;
  undefined8 uVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  undefined8 uVar7;
  void *pvVar8;
  char *pcVar9;
  long lVar10;
  byte bVar11;
  FILE *pFVar12;
  ulong __n;
  ulong uVar13;
  uint __c;
  FILE *stream;
  byte *pbVar14;
  OperationConfig *config;
  curl_slist *old;
  byte *pbVar15;
  long lVar16;
  void *local_70;
  undefined8 local_60;
  char *scheme_1;
  long response;
  int local_44;
  byte *local_40;
  char *scheme;
  
  scheme = (char *)0x0;
  if (*(long *)((long)userdata + 0x10) == 0) {
    return 0xffffffff;
  }
  __n = nmemb * size;
  if ((*(long *)(*(long *)((long)userdata + 0x10) + 0xe0) != 0) &&
     (*(FILE **)((long)userdata + 0x108) != (FILE *)0x0)) {
    sVar5 = fwrite(ptr,size,nmemb,*(FILE **)((long)userdata + 0x108));
    if (sVar5 != __n) {
      return sVar5;
    }
    iVar4 = fflush(*(FILE **)((long)userdata + 0x108));
    if (iVar4 != 0) {
      errorf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x528),
             "Failed writing headers to %s",*(undefined8 *)(*(long *)((long)userdata + 0x10) + 0xe0)
            );
      return 0xffffffff;
    }
  }
  hdrcbdata = (HdrCbData *)((long)userdata + 0x148);
  outs = (OutStruct *)((long)userdata + 0xd0);
  pbVar14 = (byte *)(ptr + __n);
  curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x100031,&scheme);
  scheme = proto_token(scheme);
  if ((scheme == proto_http) || (scheme == proto_https)) {
    response = 0;
    curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x200002,&response);
    if (response - 200U < 200) {
      if (((*(long *)(*(long *)((long)userdata + 0x10) + 0x300) == 0) ||
          (*(long *)((long)userdata + 0x130) == 0)) ||
         (iVar4 = curl_strnequal(ptr,"etag:",5), iVar4 == 0)) {
        if (*(char *)((long)userdata + 0x178) == '\x01') {
          if ((0x14 < __n) && (iVar4 = curl_strnequal(ptr,"Content-disposition:",0x14), iVar4 != 0))
          {
            pbVar15 = (byte *)(ptr + 0x14);
            while( true ) {
              for (; ((pbVar15 < pbVar14 && (*pbVar15 != 0)) &&
                     ((byte)((*pbVar15 & 0xdf) + 0xa5) < 0xe6)); pbVar15 = pbVar15 + 1) {
              }
              if (pbVar14 + -9 < pbVar15) goto LAB_0010b524;
              iVar4 = bcmp(pbVar15,"filename=",9);
              if (iVar4 == 0) break;
              while( true ) {
                if ((pbVar14 <= pbVar15) || (*pbVar15 == 0)) goto LAB_0010b524;
                if (*pbVar15 == 0x3b) break;
                pbVar15 = pbVar15 + 1;
              }
            }
            pbVar15 = pbVar15 + 9;
            pbVar6 = (byte *)malloc((size_t)(ptr + (__n - (long)pbVar15) + 1));
            if (pbVar6 != (byte *)0x0) {
              memcpy(pbVar6,pbVar15,(size_t)(ptr + (__n - (long)pbVar15)));
              pbVar6[(long)(ptr + (__n - (long)pbVar15))] = 0;
              bVar11 = *pbVar6;
              __c = (uint)bVar11;
              if ((bVar11 == 0x27) || (bVar11 == 0x22)) {
                pbVar15 = pbVar6 + 1;
              }
              else {
                __c = 0x3b;
                pbVar15 = pbVar6;
              }
              pcVar9 = strchr((char *)pbVar15,__c);
              if (pcVar9 != (char *)0x0) {
                *pcVar9 = '\0';
              }
              pcVar9 = strrchr((char *)pbVar15,0x2f);
              if (pcVar9 == (char *)0x0) {
LAB_0010b4a3:
                pcVar9 = strrchr((char *)pbVar15,0x5c);
                if (pcVar9 != (char *)0x0) {
                  if (pcVar9[1] == '\0') goto LAB_0010b51c;
                  pbVar15 = (byte *)(pcVar9 + 1);
                }
                pcVar9 = strchr((char *)pbVar15,0xd);
                if (pcVar9 != (char *)0x0) {
                  *pcVar9 = '\0';
                }
                pcVar9 = strchr((char *)pbVar15,10);
                if (pcVar9 != (char *)0x0) {
                  *pcVar9 = '\0';
                }
                if (pbVar6 != pbVar15) {
                  sVar5 = strlen((char *)pbVar15);
                  memmove(pbVar6,pbVar15,sVar5 + 1);
                }
                if (*(long *)((long)userdata + 0xe0) != 0) {
                  free(pbVar6);
                  return 0xffffffff;
                }
                config = *(OperationConfig **)((long)userdata + 0x10);
                if (config->output_dir == (char *)0x0) {
                  outs->filename = (char *)pbVar6;
                }
                else {
                  pcVar9 = (char *)curl_maprintf("%s/%s",config->output_dir,pbVar6);
                  outs->filename = pcVar9;
                  free(pbVar6);
                  if (pcVar9 == (char *)0x0) {
                    return 0xffffffff;
                  }
                  config = *(OperationConfig **)((long)userdata + 0x10);
                }
                *(undefined4 *)((long)userdata + 0xd8) = 0x10101;
                *(undefined1 *)((long)userdata + 0x178) = 0;
                _Var3 = tool_create_output_file(outs,config);
                if (!_Var3) {
                  return 0xffffffff;
                }
                iVar4 = tool_write_headers(hdrcbdata,*(FILE **)((long)userdata + 0xe0));
                if (iVar4 != 0) {
                  return 0xffffffff;
                }
              }
              else {
                if (pcVar9[1] != '\0') {
                  pbVar15 = (byte *)(pcVar9 + 1);
                  goto LAB_0010b4a3;
                }
LAB_0010b51c:
                free(pbVar6);
              }
            }
LAB_0010b524:
            stream = *(FILE **)((long)userdata + 0xe0);
            if (stream == (FILE *)0x0) {
              _Var3 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10));
              if (!_Var3) {
                return 0xffffffff;
              }
              stream = *(FILE **)((long)userdata + 0xe0);
            }
            iVar4 = tool_write_headers(hdrcbdata,stream);
            if (iVar4 != 0) {
              return 0xffffffff;
            }
          }
          if ((*(char *)((long)userdata + 0x178) == '\x01') &&
             (*(char *)(*(long *)((long)userdata + 0x150) + 0x1e7) == '\x01')) {
            pvVar8 = (void *)curl_maprintf("%.*s",__n & 0xffffffff,ptr);
            uVar2 = *(undefined8 *)((long)userdata + 0x170);
            if (pvVar8 == (void *)0x0) {
              curl_slist_free_all(uVar2);
              *(undefined8 *)((long)userdata + 0x170) = 0;
            }
            else {
              uVar7 = curl_slist_append(uVar2,pvVar8);
              *(undefined8 *)((long)userdata + 0x170) = uVar7;
              free(pvVar8);
              if (*(long *)((long)userdata + 0x170) != 0) {
                return __n;
              }
              curl_slist_free_all(uVar2);
            }
            return 0xffffffff;
          }
        }
      }
      else if (pbVar14[-1] == 10) {
        pbVar6 = pbVar14 + -1;
        sVar5 = __n - 5;
        for (pbVar15 = (byte *)(ptr + 5);
            ((*pbVar15 == 0x20 || (*pbVar15 == 9)) && (pbVar15 < pbVar6)); pbVar15 = pbVar15 + 1) {
          sVar5 = sVar5 - 1;
        }
        bVar11 = 10;
        while (((bVar11 == 9 || (bVar11 == 0x20)) || ((byte)(bVar11 - 10) < 4))) {
          pbVar1 = pbVar6 + -1;
          pbVar6 = pbVar6 + -1;
          sVar5 = sVar5 - 1;
          bVar11 = *pbVar1;
        }
        if (pbVar15 <= pbVar6) {
          iVar4 = fileno(*(FILE **)((long)userdata + 0x130));
          iVar4 = ftruncate64(iVar4,0);
          if (iVar4 != 0) {
            return 0xffffffff;
          }
          fwrite(pbVar15,size,sVar5,*(FILE **)((long)userdata + 0x130));
          fputc(10,*(FILE **)((long)userdata + 0x130));
          fflush(*(FILE **)((long)userdata + 0x130));
        }
      }
    }
  }
  lVar10 = *(long *)((long)userdata + 0x150);
  if (*(long *)(lVar10 + 0x358) != 0) {
    pvVar8 = memchr(ptr,0x3a,__n);
    if (pvVar8 == (void *)0x0) {
      if ((*ptr == '\r') || (*ptr == '\n')) {
        *(undefined1 *)((long)userdata + 0x1da) = 1;
      }
    }
    else {
      if (*(char *)((long)userdata + 0x1da) == '\0') {
        lVar16 = *(long *)((long)userdata + 0x180) + 1;
      }
      else {
        lVar16 = 1;
      }
      *(undefined1 *)((long)userdata + 0x1da) = 0;
      *(long *)((long)userdata + 0x180) = lVar16;
    }
  }
  if (*(char *)(lVar10 + 0x1e7) != '\x01') {
    return __n;
  }
  if ((((scheme != proto_http) && (scheme != proto_https)) && (scheme != proto_rtsp)) &&
     (scheme != proto_file)) {
    return __n;
  }
  if ((*(long *)((long)userdata + 0xe0) == 0) &&
     (_Var3 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10)), !_Var3)) {
    return 0xffffffff;
  }
  if (((hdrcbdata->global->isatty != true) || (hdrcbdata->global->styled_output != true)) ||
     (pvVar8 = memchr(ptr,0x3a,__n), pvVar8 == (void *)0x0)) {
    pFVar12 = *(FILE **)((long)userdata + 0xe0);
    sVar5 = __n;
LAB_0010b7c7:
    fwrite(ptr,sVar5,1,pFVar12);
    return __n;
  }
  uVar13 = (long)pvVar8 - (long)ptr;
  curl_mfprintf(*(undefined8 *)((long)userdata + 0xe0),"\x1b[1m%.*s\x1b[0m:",uVar13 & 0xffffffff,ptr
               );
  iVar4 = curl_strnequal("Location",ptr,uVar13);
  if (iVar4 == 0) {
    ptr = (char *)((long)pvVar8 + 1);
    pFVar12 = *(FILE **)((long)userdata + 0xe0);
    sVar5 = ~uVar13 + __n;
    goto LAB_0010b7c7;
  }
  uVar2 = *(undefined8 *)((long)userdata + 0x20);
  pFVar12 = *(FILE **)((long)userdata + 0xe0);
  __ptr = (void *)((long)pvVar8 + 1);
  response = 0;
  scheme_1 = (char *)0x0;
  pbVar15 = (byte *)(~uVar13 + __n);
  local_60 = 0;
  pcVar9 = getenv("VTE_VERSION");
  if (pcVar9 == (char *)0x0) {
LAB_0010b78c:
    for (pbVar6 = (byte *)0x0; iVar4 = (int)pbVar15, local_40 = pbVar15,
        pbVar14 + (-1 - (long)pvVar8) != pbVar6; pbVar6 = pbVar6 + 1) {
      if ((*(byte *)((long)__ptr + (long)pbVar6) != 0x20) &&
         (*(byte *)((long)__ptr + (long)pbVar6) != 9)) {
        iVar4 = (int)pbVar6;
        local_40 = pbVar6;
        break;
      }
    }
    local_40 = (byte *)((long)__ptr + (long)local_40);
    for (pbVar14 = pbVar14 + (-(long)pbVar6 - (long)pvVar8);
        (pbVar14 != (byte *)0x1 &&
        ((local_40[(long)(pbVar14 + -2)] == 0xd || (local_40[(long)(pbVar14 + -2)] == 10))));
        pbVar14 = pbVar14 + -1) {
    }
    lVar16 = curl_url();
    if (lVar16 == 0) {
      local_70 = (void *)0x0;
      lVar16 = 0;
    }
    else {
      local_70 = malloc((size_t)pbVar14);
      if (local_70 == (void *)0x0) {
        local_70 = (void *)0x0;
      }
      else {
        local_44 = iVar4;
        memcpy(local_70,local_40,(size_t)(pbVar14 + -1));
        *(byte *)((long)local_70 + (long)(pbVar14 + -1)) = 0;
        iVar4 = curl_easy_getinfo(uVar2,0x100001,&response);
        if (((((iVar4 == 0) && (iVar4 = curl_url_set(lVar16,0,response,0), iVar4 == 0)) &&
             (iVar4 = curl_url_set(lVar16,0,local_70,0), iVar4 == 0)) &&
            ((iVar4 = curl_url_get(lVar16,0,&local_60,2), iVar4 == 0 &&
             (iVar4 = curl_url_get(lVar16,1,&scheme_1,0), pcVar9 = scheme_1, iVar4 == 0)))) &&
           (((iVar4 = strcmp("http",scheme_1), iVar4 == 0 ||
             ((iVar4 = strcmp("https",pcVar9), iVar4 == 0 ||
              (iVar4 = strcmp("ftp",pcVar9), iVar4 == 0)))) ||
            (iVar4 = strcmp("ftps",pcVar9), iVar4 == 0)))) {
          curl_mfprintf(pFVar12,"%.*s\x1b]8;;%s\x1b\\%.*s\x1b]8;;\x1b\\",local_44,__ptr,local_60,
                        (int)pbVar15 - local_44,local_40);
          goto LAB_0010b9ce;
        }
      }
    }
  }
  else {
    local_70 = (void *)0x0;
    lVar10 = strtol(pcVar9,(char **)0x0,10);
    lVar16 = 0;
    if (0x12c0 < lVar10 - 1U) goto LAB_0010b78c;
  }
  fwrite(__ptr,(size_t)pbVar15,1,pFVar12);
  if (lVar16 == 0) {
    return __n;
  }
LAB_0010b9ce:
  curl_free(local_60);
  curl_free(scheme_1);
  curl_url_cleanup(lVar16);
  free(local_70);
  return __n;
}

Assistant:

size_t tool_header_cb(char *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct per_transfer *per = userdata;
  struct HdrCbData *hdrcbdata = &per->hdrcbdata;
  struct OutStruct *outs = &per->outs;
  struct OutStruct *heads = &per->heads;
  struct OutStruct *etag_save = &per->etag_save;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char *)ptr + cb;
  const char *scheme = NULL;

  if(!per->config)
    return CURL_WRITEFUNC_ERROR;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(per->config->global, "Header data exceeds single call write limit");
    return CURL_WRITEFUNC_ERROR;
  }
#endif

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(per->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
    /* flush the stream to send off what we got earlier */
    if(fflush(heads->stream)) {
      errorf(per->config->global, "Failed writing headers to %s",
             per->config->headerfile);
      return CURL_WRITEFUNC_ERROR;
    }
  }

  curl_easy_getinfo(per->curl, CURLINFO_SCHEME, &scheme);
  scheme = proto_token(scheme);
  if((scheme == proto_http || scheme == proto_https)) {
    long response = 0;
    curl_easy_getinfo(per->curl, CURLINFO_RESPONSE_CODE, &response);

    if((response/100 != 2) && (response/100 != 3))
      /* only care about etag and content-disposition headers in 2xx and 3xx
         responses */
      ;
    /*
     * Write etag to file when --etag-save option is given.
     */
    else if(per->config->etag_save_file && etag_save->stream &&
            /* match only header that start with etag (case insensitive) */
            checkprefix("etag:", str)) {
      const char *etag_h = &str[5];
      const char *eot = end - 1;
      if(*eot == '\n') {
        while(ISBLANK(*etag_h) && (etag_h < eot))
          etag_h++;
        while(ISSPACE(*eot))
          eot--;

        if(eot >= etag_h) {
          size_t etag_length = eot - etag_h + 1;
          /*
           * Truncate the etag save stream, it can have an existing etag value.
           */
#ifdef HAVE_FTRUNCATE
          if(ftruncate(fileno(etag_save->stream), 0)) {
            return CURL_WRITEFUNC_ERROR;
          }
#else
          if(fseek(etag_save->stream, 0, SEEK_SET)) {
            return CURL_WRITEFUNC_ERROR;
          }
#endif

          fwrite(etag_h, size, etag_length, etag_save->stream);
          /* terminate with newline */
          fputc('\n', etag_save->stream);
          (void)fflush(etag_save->stream);
        }
      }
    }

    /*
     * This callback sets the filename where output shall be written when
     * curl options --remote-name (-O) and --remote-header-name (-J) have
     * been simultaneously given and additionally server returns an HTTP
     * Content-Disposition header specifying a filename property.
     */

    else if(hdrcbdata->honor_cd_filename) {
      if((cb > 20) && checkprefix("Content-disposition:", str)) {
        const char *p = str + 20;

        /* look for the 'filename=' parameter
           (encoded filenames (*=) are not supported) */
        for(;;) {
          char *filename;
          size_t len;

          while((p < end) && *p && !ISALPHA(*p))
            p++;
          if(p > end - 9)
            break;

          if(memcmp(p, "filename=", 9)) {
            /* no match, find next parameter */
            while((p < end) && *p && (*p != ';'))
              p++;
            if((p < end) && *p)
              continue;
            else
              break;
          }
          p += 9;

          len = cb - (size_t)(p - str);
          filename = parse_filename(p, len);
          if(filename) {
            if(outs->stream) {
              /* indication of problem, get out! */
              free(filename);
              return CURL_WRITEFUNC_ERROR;
            }

            if(per->config->output_dir) {
              outs->filename = aprintf("%s/%s", per->config->output_dir,
                                       filename);
              free(filename);
              if(!outs->filename)
                return CURL_WRITEFUNC_ERROR;
            }
            else
              outs->filename = filename;

            outs->is_cd_filename = TRUE;
            outs->s_isreg = TRUE;
            outs->fopened = FALSE;
            outs->alloc_filename = TRUE;
            hdrcbdata->honor_cd_filename = FALSE; /* done now! */
            if(!tool_create_output_file(outs, per->config))
              return CURL_WRITEFUNC_ERROR;
            if(tool_write_headers(&per->hdrcbdata, outs->stream))
              return CURL_WRITEFUNC_ERROR;
          }
          break;
        }
        if(!outs->stream && !tool_create_output_file(outs, per->config))
          return CURL_WRITEFUNC_ERROR;
        if(tool_write_headers(&per->hdrcbdata, outs->stream))
          return CURL_WRITEFUNC_ERROR;
      } /* content-disposition handling */

      if(hdrcbdata->honor_cd_filename &&
         hdrcbdata->config->show_headers) {
        /* still awaiting the Content-Disposition header, store the header in
           memory. Since it is not zero terminated, we need an extra dance. */
        char *clone = aprintf("%.*s", (int)cb, (char *)str);
        if(clone) {
          struct curl_slist *old = hdrcbdata->headlist;
          hdrcbdata->headlist = curl_slist_append(old, clone);
          free(clone);
          if(!hdrcbdata->headlist) {
            curl_slist_free_all(old);
            return CURL_WRITEFUNC_ERROR;
          }
        }
        else {
          curl_slist_free_all(hdrcbdata->headlist);
          hdrcbdata->headlist = NULL;
          return CURL_WRITEFUNC_ERROR;
        }
        return cb; /* done for now */
      }
    }
  }
  if(hdrcbdata->config->writeout) {
    char *value = memchr(ptr, ':', cb);
    if(value) {
      if(per->was_last_header_empty)
        per->num_headers = 0;
      per->was_last_header_empty = FALSE;
      per->num_headers++;
    }
    else if(ptr[0] == '\r' || ptr[0] == '\n')
      per->was_last_header_empty = TRUE;
  }
  if(hdrcbdata->config->show_headers &&
    (scheme == proto_http || scheme == proto_https ||
     scheme == proto_rtsp || scheme == proto_file)) {
    /* bold headers only for selected protocols */
    char *value = NULL;

    if(!outs->stream && !tool_create_output_file(outs, per->config))
      return CURL_WRITEFUNC_ERROR;

    if(hdrcbdata->global->isatty &&
#ifdef _WIN32
       tool_term_has_bold &&
#endif
       hdrcbdata->global->styled_output)
      value = memchr(ptr, ':', cb);
    if(value) {
      size_t namelen = value - ptr;
      fprintf(outs->stream, BOLD "%.*s" BOLDOFF ":", (int)namelen, ptr);
#ifndef LINK
      fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#else
      if(curl_strnequal("Location", ptr, namelen)) {
        write_linked_location(per->curl, &value[1], cb - namelen - 1,
            outs->stream);
      }
      else
        fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#endif
    }
    else
      /* not "handled", just show it */
      fwrite(ptr, cb, 1, outs->stream);
  }
  return cb;
}